

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<tinyusdz::value::matrix4f> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<tinyusdz::value::matrix4f>
          (optional<tinyusdz::value::matrix4f> *__return_storage_ptr__,PrimVar *this)

{
  optional<tinyusdz::value::matrix4f> local_54;
  
  get_value<tinyusdz::value::matrix4f>(&local_54,this);
  __return_storage_ptr__->has_value_ = local_54.has_value_;
  if (local_54.has_value_ == true) {
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = local_54.contained._48_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = local_54.contained._56_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = local_54.contained._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = local_54.contained._40_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_54.contained._16_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_54.contained._24_8_;
    *(undefined8 *)&__return_storage_ptr__->contained = local_54.contained._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_54.contained._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }